

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O2

CategoricalMapping *
google::protobuf::Arena::CreateMessageInternal<CoreML::Specification::CategoricalMapping>
          (Arena *arena)

{
  CategoricalMapping *pCVar1;
  
  if (arena != (Arena *)0x0) {
    pCVar1 = DoCreateMessage<CoreML::Specification::CategoricalMapping>(arena);
    return pCVar1;
  }
  pCVar1 = (CategoricalMapping *)operator_new(0x30);
  CoreML::Specification::CategoricalMapping::CategoricalMapping(pCVar1,(Arena *)0x0,false);
  return pCVar1;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }